

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O1

void __thiscall VertexAttrib64Bit::VAOTest::VAOTest(VAOTest *this,Context *context)

{
  Base::Base(&this->super_Base,context,"vao",
             "Verify that non-trivial VAO configurations are correctly supported for double-precision floating-point types."
            );
  (this->super_Base).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_021230d8;
  this->m_bo_1_data = (uchar *)0x0;
  this->m_bo_1_data_size = 0;
  this->m_bo_1_offset_matrix = 0;
  this->m_bo_1_offset_ubyte = 0x48;
  this->m_bo_1_offset_short = 0x49;
  this->m_bo_1_offset_double = 0x4b;
  this->m_bo_2_data = (uchar *)0x0;
  this->m_bo_2_data_size = 0;
  this->m_bo_2_offset_sbyte = 0;
  this->m_bo_2_offset_matrix = 1;
  this->m_bo_index_data = (unsigned_short *)0x0;
  this->m_bo_index_data_size = 0;
  this->m_bo_id_1 = 0;
  this->m_bo_id_1 = 0;
  this->m_bo_id_2 = 0;
  this->m_bo_id_indices = 0;
  this->m_bo_id_result = 0;
  this->m_po_bo1_dmat3_attr_location = -1;
  this->m_po_bo2_dmat4x2_attr_location = -1;
  this->m_po_bo1_double_attr_location = -1;
  this->m_po_bo1_dvec2_attr_location = -1;
  this->m_po_bo1_dvec2_attr_location = -1;
  this->m_po_bo1_float2_attr_location = -1;
  this->m_po_bo1_int_attr_location = -1;
  this->m_po_bo2_float_attr_location = -1;
  this->m_po_id = 0;
  this->m_vao_id = 0;
  this->m_vs_id = 0;
  this->m_xfb_bo1_dmat3_offset = 0;
  this->m_xfb_bo1_dmat3_size = 0;
  this->m_xfb_bo1_double_offset = 0;
  this->m_xfb_bo1_double_size = 0;
  this->m_xfb_bo1_dvec2_offset = 0;
  this->m_xfb_bo1_dvec2_size = 0;
  this->m_xfb_bo1_float2_offset = 0;
  this->m_xfb_bo1_float2_size = 0;
  this->m_xfb_bo1_int_offset = 0;
  this->m_xfb_bo1_int_size = 0;
  this->m_xfb_bo2_dmat4x2_offset = 0;
  this->m_xfb_bo2_dmat4x2_size = 0;
  this->m_xfb_bo2_float_offset = 0;
  this->m_xfb_bo2_float_size = 0;
  this->m_xfb_total_size = 0;
  this->m_bo_1_batch_size = 0x60;
  this->m_bo_2_batch_size = 0x41;
  this->m_n_batches = 0x400;
  this->m_n_draw_call_instances = 4;
  this->m_nonzero_vertex_attrib_divisor = 2;
  this->m_po_bo1_dmat3_attr_offset = 0;
  this->m_po_bo1_dmat3_attr_stride = 0x60;
  this->m_po_bo1_double_attr_offset = 0;
  this->m_po_bo1_double_attr_stride = 0x30;
  this->m_po_bo1_dvec2_attr_offset = 0x4b;
  this->m_po_bo1_dvec2_attr_stride = 0x60;
  this->m_po_bo1_float2_attr_offset = 0x49;
  this->m_po_bo1_float2_attr_stride = 0x60;
  this->m_po_bo1_int_attr_offset = 0x48;
  this->m_po_bo1_int_attr_stride = 0x60;
  this->m_po_bo2_dmat4x2_attr_offset = 1;
  this->m_po_bo2_dmat4x2_attr_stride = 0x41;
  this->m_po_bo2_float_attr_offset = 0;
  this->m_po_bo2_float_attr_stride = 5;
  return;
}

Assistant:

VAOTest::VAOTest(deqp::Context& context)
	: Base(context, "vao", "Verify that non-trivial VAO configurations are correctly supported "
						   "for double-precision floating-point types.")
	, m_bo_1_data(DE_NULL)
	, m_bo_1_data_size(0)
	, m_bo_1_offset_matrix(0)
	, m_bo_1_offset_ubyte(72)
	, m_bo_1_offset_short(73)
	, m_bo_1_offset_double(75)
	, m_bo_2_data(DE_NULL)
	, m_bo_2_data_size(0)
	, m_bo_2_offset_sbyte(0)
	, m_bo_2_offset_matrix(1)
	, m_bo_index_data(DE_NULL)
	, m_bo_index_data_size(0)
	, m_bo_id_1(0)
	, m_bo_id_2(0)
	, m_bo_id_indices(0)
	, m_bo_id_result(0)
	, m_po_bo1_dmat3_attr_location(-1)
	, m_po_bo2_dmat4x2_attr_location(-1)
	, m_po_bo1_double_attr_location(-1)
	, m_po_bo1_dvec2_attr_location(-1)
	, m_po_bo1_float2_attr_location(-1)
	, m_po_bo1_int_attr_location(-1)
	, m_po_bo2_float_attr_location(-1)
	, m_po_id(0)
	, m_vao_id(0)
	, m_vs_id(0)
	, m_xfb_bo1_dmat3_offset(0)
	, m_xfb_bo1_dmat3_size(0)
	, m_xfb_bo1_double_offset(0)
	, m_xfb_bo1_double_size(0)
	, m_xfb_bo1_dvec2_offset(0)
	, m_xfb_bo1_dvec2_size(0)
	, m_xfb_bo1_float2_offset(0)
	, m_xfb_bo1_float2_size(0)
	, m_xfb_bo1_int_offset(0)
	, m_xfb_bo1_int_size(0)
	, m_xfb_bo2_dmat4x2_offset(0)
	, m_xfb_bo2_dmat4x2_size(0)
	, m_xfb_bo2_float_offset(0)
	, m_xfb_bo2_float_size(0)
	, m_xfb_total_size(0)
	, m_bo_1_batch_size(96)
	, m_bo_2_batch_size(65)
	, m_n_batches(1024)
	, m_n_draw_call_instances(4)
	, m_nonzero_vertex_attrib_divisor(2)
	, m_po_bo1_dmat3_attr_offset(0)
	, m_po_bo1_dmat3_attr_stride(96)
	, m_po_bo1_double_attr_offset(0)
	, m_po_bo1_double_attr_stride(48)
	, m_po_bo1_dvec2_attr_offset(75)
	, m_po_bo1_dvec2_attr_stride(96)
	, m_po_bo1_float2_attr_offset(73)
	, m_po_bo1_float2_attr_stride(96)
	, m_po_bo1_int_attr_offset(72)
	, m_po_bo1_int_attr_stride(96)
	, m_po_bo2_dmat4x2_attr_offset(1)
	, m_po_bo2_dmat4x2_attr_stride(65)
	, m_po_bo2_float_attr_offset(0)
	, m_po_bo2_float_attr_stride(5)
{
	/* Nothing to be done here */
}